

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O0

string * __thiscall
cmNinjaTargetGenerator::ComputeFlagsForObject
          (string *__return_storage_ptr__,cmNinjaTargetGenerator *this,cmSourceFile *source,
          string *language)

{
  cmLocalNinjaGenerator *pcVar1;
  cmGeneratorTarget *headTarget;
  bool bVar2;
  string *psVar3;
  char *expression;
  char *coptions;
  undefined1 local_138 [8];
  string COMPILE_OPTIONS;
  char *cflags;
  undefined1 local_108 [8];
  string COMPILE_FLAGS;
  string local_c8;
  undefined1 local_a8 [8];
  cmGeneratorExpressionInterpreter genexInterpreter;
  string *language_local;
  cmSourceFile *source_local;
  cmNinjaTargetGenerator *this_local;
  string *flags;
  
  cmCommonTargetGenerator::GetFlags
            (__return_storage_ptr__,&this->super_cmCommonTargetGenerator,language);
  bVar2 = std::operator==(language,"Fortran");
  if (bVar2) {
    cmCommonTargetGenerator::AppendFortranFormatFlags
              (&this->super_cmCommonTargetGenerator,__return_storage_ptr__,source);
  }
  pcVar1 = this->LocalGenerator;
  psVar3 = cmLocalCommonGenerator::GetConfigName_abi_cxx11_(&pcVar1->super_cmLocalCommonGenerator);
  std::__cxx11::string::string((string *)&local_c8,(string *)psVar3);
  headTarget = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  std::__cxx11::string::string
            ((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8),(string *)language);
  cmGeneratorExpressionInterpreter::cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_a8,(cmLocalGenerator *)pcVar1,&local_c8,
             headTarget,(string *)((long)&COMPILE_FLAGS.field_2 + 8));
  std::__cxx11::string::~string((string *)(COMPILE_FLAGS.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_108,"COMPILE_FLAGS",(allocator<char> *)((long)&cflags + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&cflags + 7));
  COMPILE_OPTIONS.field_2._8_8_ = cmSourceFile::GetProperty(source,(string *)local_108);
  if ((char *)COMPILE_OPTIONS.field_2._8_8_ != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_a8,
                        (char *)COMPILE_OPTIONS.field_2._8_8_,(string *)local_108);
    (*(pcVar1->super_cmLocalCommonGenerator).super_cmLocalGenerator._vptr_cmLocalGenerator[6])
              (pcVar1,__return_storage_ptr__,psVar3);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_138,"COMPILE_OPTIONS",(allocator<char> *)((long)&coptions + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&coptions + 7));
  expression = cmSourceFile::GetProperty(source,(string *)local_138);
  if (expression != (char *)0x0) {
    pcVar1 = this->LocalGenerator;
    psVar3 = cmGeneratorExpressionInterpreter::Evaluate
                       ((cmGeneratorExpressionInterpreter *)local_a8,expression,(string *)local_138)
    ;
    cmLocalGenerator::AppendCompileOptions
              ((cmLocalGenerator *)pcVar1,__return_storage_ptr__,psVar3,(char *)0x0);
  }
  std::__cxx11::string::~string((string *)local_138);
  std::__cxx11::string::~string((string *)local_108);
  cmGeneratorExpressionInterpreter::~cmGeneratorExpressionInterpreter
            ((cmGeneratorExpressionInterpreter *)local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmNinjaTargetGenerator::ComputeFlagsForObject(
  cmSourceFile const* source, const std::string& language)
{
  std::string flags = this->GetFlags(language);

  // Add Fortran format flags.
  if (language == "Fortran") {
    this->AppendFortranFormatFlags(flags, *source);
  }

  // Add source file specific flags.
  cmGeneratorExpressionInterpreter genexInterpreter(
    this->LocalGenerator, this->LocalGenerator->GetConfigName(),
    this->GeneratorTarget, language);

  const std::string COMPILE_FLAGS("COMPILE_FLAGS");
  if (const char* cflags = source->GetProperty(COMPILE_FLAGS)) {
    this->LocalGenerator->AppendFlags(
      flags, genexInterpreter.Evaluate(cflags, COMPILE_FLAGS));
  }

  const std::string COMPILE_OPTIONS("COMPILE_OPTIONS");
  if (const char* coptions = source->GetProperty(COMPILE_OPTIONS)) {
    this->LocalGenerator->AppendCompileOptions(
      flags, genexInterpreter.Evaluate(coptions, COMPILE_OPTIONS));
  }

  return flags;
}